

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::moveCursorRow(PatternModel *this,int amount,SelectMode mode)

{
  SelectMode mode_local;
  int amount_local;
  PatternModel *this_local;
  
  if (((this->mPlaying & 1U) == 0) || ((this->mFollowing & 1U) == 0)) {
    if (mode == SelectionModify) {
      selectCursor(this);
    }
    else if (mode == SelectionRemove) {
      deselect(this);
    }
    setCursorRow(this,(this->mCursor).super_PatternCursorBase.row + amount);
    if (mode == SelectionModify) {
      selectCursor(this);
    }
  }
  return;
}

Assistant:

void PatternModel::moveCursorRow(int amount, SelectMode mode) {
    if (mPlaying && mFollowing) {
        return;
    }
    
    if (mode == SelectionModify) {
        selectCursor();
    } else if (mode == SelectionRemove) {
        deselect();
    }
    setCursorRow(mCursor.row + amount);
    if (mode == SelectionModify) {
        selectCursor();
    }
}